

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

error_info * __thiscall
toml::detail::context<toml::type_config>::pop_last_error
          (error_info *__return_storage_ptr__,context<toml::type_config> *this)

{
  error_info::error_info
            (__return_storage_ptr__,
             (this->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  std::vector<toml::error_info,_std::allocator<toml::error_info>_>::pop_back(&this->errors_);
  return __return_storage_ptr__;
}

Assistant:

error_info pop_last_error()
    {
        assert( ! errors_.empty());
        auto e = std::move(errors_.back());
        errors_.pop_back();
        return e;
    }